

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

ssize_t __thiscall io_buf::fill(io_buf *this,int f)

{
  char *pcVar1;
  long lVar2;
  char **ppcVar3;
  undefined4 in_ESI;
  long *in_RDI;
  ssize_t num_read;
  size_t head_loc;
  size_t in_stack_00000178;
  v_array<char> *in_stack_00000180;
  long local_8;
  
  pcVar1 = (char *)in_RDI[4];
  ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 2));
  if (pcVar1 == *ppcVar3) {
    lVar2 = in_RDI[0xc];
    ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 2));
    pcVar1 = *ppcVar3;
    v_array<char>::begin((v_array<char> *)(in_RDI + 2));
    v_array<char>::resize(in_stack_00000180,in_stack_00000178);
    ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 2));
    in_RDI[0xc] = (long)(*ppcVar3 + (lVar2 - (long)pcVar1));
  }
  ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 2));
  pcVar1 = *ppcVar3;
  lVar2 = in_RDI[4];
  ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 2));
  local_8 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_ESI,pcVar1,lVar2 - (long)*ppcVar3);
  if (local_8 < 0) {
    local_8 = 0;
  }
  else {
    ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 2));
    pcVar1 = *ppcVar3;
    ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 2));
    *ppcVar3 = pcVar1 + local_8;
  }
  return local_8;
}

Assistant:

ssize_t fill(int f)
  {  // if the loaded values have reached the allocated space
    if (space.end_array - space.end() == 0)
    {  // reallocate to twice as much space
      size_t head_loc = head - space.begin();
      space.resize(2 * (space.end_array - space.begin()));
      head = space.begin() + head_loc;
    }
    // read more bytes from file up to the remaining allocated space
    ssize_t num_read = read_file(f, space.end(), space.end_array - space.end());
    if (num_read >= 0)
    {  // if some bytes were actually loaded, update the end of loaded values
      space.end() = space.end() + num_read;
      return num_read;
    }
    else
      return 0;
  }